

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockchain_tests.cpp
# Opt level: O0

void __thiscall blockchain_tests::num_chain_tx_max::test_method(num_chain_tx_max *this)

{
  bool bVar1;
  long in_FS_OFFSET;
  CBlockIndex block_index;
  char *in_stack_fffffffffffffe98;
  lazy_ostream *in_stack_fffffffffffffea0;
  char *in_stack_fffffffffffffea8;
  const_string *msg;
  undefined1 *line_num;
  const_string *file;
  char *this_00;
  lazy_ostream local_f8;
  undefined1 local_e0 [32];
  const_string local_c0;
  undefined1 local_b0 [16];
  undefined1 local_a0 [80];
  unsigned_long local_50 [9];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  memset(local_a0,0,0x98);
  CBlockIndex::CBlockIndex((CBlockIndex *)in_stack_fffffffffffffea8);
  local_50[0] = std::numeric_limits<unsigned_long>::max();
  do {
    this_00 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockchain_tests.cpp"
    ;
    line_num = local_b0;
    msg = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffea8,
               (pointer)in_stack_fffffffffffffea0,(unsigned_long)in_stack_fffffffffffffe98);
    file = &local_c0;
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)this_00,file,(size_t)line_num,msg);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffffea0,(char (*) [1])in_stack_fffffffffffffe98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffea8,
               (pointer)in_stack_fffffffffffffea0,(unsigned_long)in_stack_fffffffffffffe98);
    local_f8._vptr_lazy_ostream = (_func_int **)std::numeric_limits<unsigned_long>::max();
    in_stack_fffffffffffffea8 = "std::numeric_limits<uint64_t>::max()";
    in_stack_fffffffffffffea0 = &local_f8;
    in_stack_fffffffffffffe98 = "block_index.m_chain_tx_count";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_e0,&local_f8.m_empty,0x75,1,2,local_50);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffe98);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(num_chain_tx_max)
{
    CBlockIndex block_index{};
    block_index.m_chain_tx_count = std::numeric_limits<uint64_t>::max();
    BOOST_CHECK_EQUAL(block_index.m_chain_tx_count, std::numeric_limits<uint64_t>::max());
}